

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error-formatter.cc
# Opt level: O0

string * wabt::FormatErrorsToString
                   (string *__return_storage_ptr__,Errors *errors,Type location_type,
                   LexerSourceLineFinder *line_finder,Color *color,string *header,
                   PrintHeader print_header,int source_line_max_length)

{
  bool bVar1;
  byte bVar2;
  ulong uVar3;
  int in_stack_ffffffffffffff60;
  string local_88;
  int local_64;
  reference pEStack_60;
  int indent;
  Error *error;
  const_iterator __end1;
  const_iterator __begin1;
  Errors *__range1;
  string *header_local;
  Color *color_local;
  LexerSourceLineFinder *line_finder_local;
  Type location_type_local;
  Errors *errors_local;
  string *result;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  __end1 = std::vector<wabt::Error,_std::allocator<wabt::Error>_>::begin(errors);
  error = (Error *)std::vector<wabt::Error,_std::allocator<wabt::Error>_>::end(errors);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                                *)&error);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
    pEStack_60 = __gnu_cxx::
                 __normal_iterator<const_wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
                 ::operator*(&__end1);
    uVar3 = std::__cxx11::string::empty();
    if (((uVar3 & 1) == 0) && (print_header != Never)) {
      if (print_header == Once) {
        print_header = Never;
      }
      else if (print_header != Always) goto LAB_00295dab;
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)header);
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,":\n");
    }
LAB_00295dab:
    bVar2 = std::__cxx11::string::empty();
    local_64 = 2;
    if ((bVar2 & 1) != 0) {
      local_64 = 0;
    }
    (anonymous_namespace)::FormatError_abi_cxx11_
              (&local_88,(_anonymous_namespace_ *)pEStack_60,(Error *)(ulong)location_type,
               (Type)color,(Color *)line_finder,
               (LexerSourceLineFinder *)(ulong)(uint)source_line_max_length,local_64,
               in_stack_ffffffffffffff60);
    std::__cxx11::string::operator+=((string *)__return_storage_ptr__,(string *)&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    __gnu_cxx::
    __normal_iterator<const_wabt::Error_*,_std::vector<wabt::Error,_std::allocator<wabt::Error>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

std::string FormatErrorsToString(const Errors& errors,
                                 Location::Type location_type,
                                 LexerSourceLineFinder* line_finder,
                                 const Color& color,
                                 const std::string& header,
                                 PrintHeader print_header,
                                 int source_line_max_length) {
  std::string result;
  for (const auto& error : errors) {
    if (!header.empty()) {
      switch (print_header) {
        case PrintHeader::Never:
          break;
        case PrintHeader::Once:
          print_header = PrintHeader::Never;
          // Fallthrough.
        case PrintHeader::Always:
          result += header;
          result += ":\n";
          break;
      }
    }

    int indent = header.empty() ? 0 : 2;

    result += FormatError(error, location_type, color, line_finder,
                          source_line_max_length, indent);
  }
  return result;
}